

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_rep_cycles.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
::update_representative_cycles
          (RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
           *this)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  pointer puVar1;
  iterator __position;
  uint uVar2;
  uint uVar3;
  pointer *ppuVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  size_type __new_size;
  undefined8 local_38;
  
  puVar1 = (this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_38._4_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->birthToCycle_,
             (ulong)*(uint *)&this[1].birthToCycle_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish,
             (value_type_conflict1 *)((long)&local_38 + 4));
  uVar2 = *(uint *)&this[1].birthToCycle_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  __new_size = 0;
  if (uVar2 != 0) {
    puVar1 = (this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppuVar4 = &this[1].representativeCycles_.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[1].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    uVar6 = 0;
    do {
      if (*ppuVar4 == (pointer)0x0 || ppuVar4 == (pointer *)*ppuVar4) {
        puVar1[uVar6] = (uint)__new_size;
        __new_size = (size_type)((uint)__new_size + 1);
        uVar2 = *(uint *)&this[1].birthToCycle_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
      ppuVar4 = ppuVar4 + 7;
    } while (uVar6 < uVar2);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_erase_at_end(&this->representativeCycles_,
                    (this->representativeCycles_).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->representativeCycles_,__new_size);
  local_38 = (ulong)local_38._4_4_ << 0x20;
  uVar2 = *(uint *)&this[2].birthToCycle_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      plVar7 = (long *)((long)this[2].representativeCycles_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish +
                       (ulong)uVar3 * 0x38 + 0x28);
      plVar5 = (long *)*plVar7;
      if (plVar5 != plVar7) {
        do {
          uVar6 = (ulong)(this->birthToCycle_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(uint *)(plVar5 + 2)];
          if (uVar6 != 0xffffffff) {
            this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                      ((this->representativeCycles_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar6);
            __position._M_current = *(uint **)(this_00 + 8);
            if (__position._M_current == *(uint **)(this_00 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(this_00,__position,(uint *)&local_38);
            }
            else {
              *__position._M_current = (uint)local_38;
              *(uint **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          plVar5 = (long *)*plVar5;
        } while (plVar5 != plVar7);
        uVar2 = *(uint *)&this[2].birthToCycle_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
        uVar3 = (uint)local_38;
      }
      uVar3 = uVar3 + 1;
      local_38 = CONCAT44(local_38._4_4_,uVar3);
    } while (uVar3 < uVar2);
  }
  return;
}

Assistant:

inline void RU_representative_cycles<Master_matrix>::update_representative_cycles() 
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    birthToCycle_.clear();
    birthToCycle_.resize(_matrix()->reducedMatrixR_.get_number_of_columns(), -1);
    Index c = 0;
    for (Index i = 0; i < _matrix()->reducedMatrixR_.get_number_of_columns(); i++) {
      if (_matrix()->reducedMatrixR_.is_zero_column(i)) {
        birthToCycle_[i] = c;
        ++c;
      }
    }
    representativeCycles_.clear();
    representativeCycles_.resize(c);
    for (Index i = 0; i < _matrix()->mirrorMatrixU_.get_number_of_columns(); i++) {
      for (const auto& entry : _matrix()->mirrorMatrixU_.get_column(i)) {
        auto idx = birthToCycle_[entry.get_row_index()];
        if (idx != Master_matrix::template get_null_value<Index>()) {
          representativeCycles_[idx].push_back(i);
        }
      }
    }
  } else {
    birthToCycle_.clear();
    birthToCycle_.resize(_matrix()->reducedMatrixR_.get_number_of_columns(), -1);
    for (Index i = 0; i < _matrix()->reducedMatrixR_.get_number_of_columns(); i++) {
      if (_matrix()->reducedMatrixR_.is_zero_column(i)) {
        representativeCycles_.push_back(Cycle());
        for (const auto& entry : _matrix()->mirrorMatrixU_.get_column(i)) {
          representativeCycles_.back().push_back(entry.get_row_index());
        }
        if constexpr (std::is_same_v<typename Master_matrix::Column, typename Master_matrix::Matrix_heap_column> ||
                      std::is_same_v<typename Master_matrix::Column,
                                     typename Master_matrix::Matrix_unordered_set_column>)
          std::sort(representativeCycles_.back().begin(), representativeCycles_.back().end());
        birthToCycle_[i] = representativeCycles_.size() - 1;
      }
    }
  }
}